

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O1

void __thiscall Simulator::jump_not_zero(Simulator *this,PCode *code)

{
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  _Elt_pointer pSVar4;
  StackSymbol symbol;
  vector<int,_std::allocator<int>_> local_58;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->label_table_,&code->first_);
  pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  iVar3 = *pmVar2;
  iVar1 = pSVar4[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,&pSVar4[-1].value_.int_array);
  local_40 = pSVar4[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&pSVar4[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  if (iVar1 == 0) {
    iVar3 = this->eip_ + 1;
  }
  this->eip_ = iVar3;
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::jump_not_zero(const PCode &code) {
    int target = label_table_[code.first()];
    StackSymbol symbol = stack_.back();
    stack_.pop_back();
    if (symbol.int_value() != 0) {
        set_eip(target);
    } else {
        inc_eip();
    }
}